

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpdata.cpp
# Opt level: O3

int __thiscall Httpdata::handle_event(Httpdata *this)

{
  enable_shared_from_this<channel> *__r;
  _Atomic_word *p_Var1;
  uint uVar2;
  int iVar3;
  TimeRoundItem<channel> *this_00;
  SP_TimeRoundItemNode<channel> *time_round_item_node;
  bool bVar4;
  shared_ptr<TimeRoundItem<channel>_> sp_time_round_item;
  __weak_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2> local_78;
  TimeRoundItem<channel> *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  shared_ptr<channel> local_38;
  
  uVar2 = (this->super_channel).Revent;
  if ((uVar2 & 1) == 0) {
    if ((uVar2 & 4) != 0) {
      (*(this->super_channel)._vptr_channel[5])(this);
    }
    goto LAB_0010da95;
  }
  (*(this->super_channel)._vptr_channel[4])(this);
  if (((this->super_channel).accept_epoll != (Epoll *)0x0) ||
     ((this->super_channel).read_length < 1)) goto LAB_0010da95;
  handle_http(this,(this->super_channel).read_buff);
  (*(this->super_channel)._vptr_channel[7])(this);
  if (((this->super_channel).time_round == (TimeRound<channel> *)0x0) ||
     ((this->super_channel).field_0x8c != '\x01')) goto LAB_0010da95;
  this_00 = (TimeRoundItem<channel> *)operator_new(0x38);
  __r = &(this->super_channel).super_enable_shared_from_this<channel>;
  std::__shared_ptr<channel,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<channel,void>
            ((__shared_ptr<channel,(__gnu_cxx::_Lock_policy)2> *)&local_78,
             (__weak_ptr<channel,_(__gnu_cxx::_Lock_policy)2> *)__r);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = channel::Close;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(element_type **)((long)local_58._M_unused._0_8_ + 0x10) = local_78._M_ptr;
  pcStack_40 = std::_Function_handler<void_(),_std::_Bind<void_(channel::*(channel_*))()>_>::
               _M_invoke;
  local_48 = std::_Function_handler<void_(),_std::_Bind<void_(channel::*(channel_*))()>_>::
             _M_manager;
  std::__shared_ptr<channel,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<channel,void>
            ((__shared_ptr<channel,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (__weak_ptr<channel,_(__gnu_cxx::_Lock_policy)2> *)__r);
  TimeRoundItem<channel>::TimeRoundItem(this_00,5,(Fun *)&local_58,&local_38);
  local_68 = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<TimeRoundItem<channel>*>
            (&local_60,this_00);
  if (local_38.super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_78._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_refcount._M_pi);
  }
  local_78._M_ptr = local_68;
  local_78._M_refcount._M_pi = local_60._M_pi;
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60._M_pi)->_M_weak_count = (local_60._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_60._M_pi)->_M_weak_count = (local_60._M_pi)->_M_weak_count + 1;
    }
  }
  std::__weak_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_channel).wp_time_round_item.
              super___weak_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>,&local_78);
  if (local_78._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_78._M_refcount._M_pi)->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = (local_78._M_refcount._M_pi)->_M_weak_count;
      (local_78._M_refcount._M_pi)->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*(local_78._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  time_round_item_node = (SP_TimeRoundItemNode<channel> *)operator_new(0x20);
  if (local_60._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    time_round_item_node->pre = (SP_TimeRoundItemNode<channel> *)0x0;
    time_round_item_node->next = (SP_TimeRoundItemNode<channel> *)0x0;
    (time_round_item_node->Item).
    super___shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
    (time_round_item_node->Item).
    super___shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
      UNLOCK();
      bVar4 = __libc_single_threaded != '\0';
      time_round_item_node->pre = (SP_TimeRoundItemNode<channel> *)0x0;
      time_round_item_node->next = (SP_TimeRoundItemNode<channel> *)0x0;
      (time_round_item_node->Item).
      super___shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
      (time_round_item_node->Item).
      super___shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_60._M_pi;
      if (bVar4) goto LAB_0010da72;
      LOCK();
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
      time_round_item_node->pre = (SP_TimeRoundItemNode<channel> *)0x0;
      time_round_item_node->next = (SP_TimeRoundItemNode<channel> *)0x0;
      (time_round_item_node->Item).
      super___shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
      (time_round_item_node->Item).
      super___shared_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_60._M_pi;
LAB_0010da72:
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
  TimeRound<channel>::AddTimeRoundItemNode((this->super_channel).time_round,time_round_item_node);
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
LAB_0010da95:
  (this->super_channel).Revent = 0;
  return 0;
}

Assistant:

int Httpdata::handle_event()
{
    if(Revent & EPOLLIN)
    {
        HandleRead();
        if(accept_epoll == nullptr)
        {
            //cout<<"recv data from client: "<<fd<<" "<<buff<<endl;
            //有读取到数据才需要处理
            if(read_length > 0)
            {
                handle_http(read_buff);
                SeparateTimer();
                if(time_round != nullptr && Keep_Alive)
                {
                    std::shared_ptr<TimeRoundItem<channel>> sp_time_round_item(new TimeRoundItem<channel>(5,bind(&Httpdata::Close,shared_from_this().get()),shared_from_this()));
                    wp_time_round_item = std::weak_ptr<TimeRoundItem<channel>>(sp_time_round_item);
                    SP_TimeRoundItemNode<channel>* sp_time_round_item_node = new SP_TimeRoundItemNode<channel>(sp_time_round_item);
                    time_round->AddTimeRoundItemNode(sp_time_round_item_node);
                }
            }
        }
    }
    else if(Revent & EPOLLOUT)
    {
        HandleWrite();
    }
    Revent = 0;
    return 0;
}